

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int descriptor_scriptpubkey_to_address
              (address_script_t *address_item,uchar *script,size_t script_len,char **output)

{
  uchar local_68;
  undefined1 auStack_67 [7];
  uchar hash [33];
  size_t local_38;
  size_t hash_len;
  int script_type;
  int ret;
  char **output_local;
  size_t script_len_local;
  uchar *script_local;
  address_script_t *address_item_local;
  
  hash_len._0_4_ = 0;
  local_38 = 0;
  if (((((script_len == 0x19) && (*script == 'v')) && (script[1] == 0xa9)) &&
      ((script[2] == '\x14' && (script[0x17] == 0x88)))) && (script[0x18] == 0xac)) {
    hash_len._0_4_ = 2;
    local_68 = address_item->version_p2pkh;
    _auStack_67 = *(undefined8 *)(script + 3);
    hash._1_8_ = *(undefined8 *)(script + 0xb);
    hash._9_4_ = *(undefined4 *)(script + 0x13);
    local_38 = 0x15;
  }
  else if (((script_len == 0x17) && (*script == 0xa9)) &&
          ((script[1] == '\x14' && (script[0x16] == 0x87)))) {
    hash_len._0_4_ = 4;
    local_68 = address_item->version_p2sh;
    _auStack_67 = *(undefined8 *)(script + 2);
    hash._1_8_ = *(undefined8 *)(script + 10);
    hash._9_4_ = *(undefined4 *)(script + 0x12);
    local_38 = 0x15;
  }
  else if (((script_len == 0x16) && (*script == '\0')) && (script[1] == '\x14')) {
    hash_len._0_4_ = 8;
  }
  else if (((script_len == 0x22) && (*script == '\0')) && (script[1] == ' ')) {
    hash_len._0_4_ = 0x10;
  }
  else {
    hash_len._4_4_ = -2;
  }
  if (((int)hash_len == 2) || ((int)hash_len == 4)) {
    hash_len._4_4_ = wally_base58_from_bytes(&local_68,local_38,1,output);
  }
  else if (((int)hash_len == 8) || ((int)hash_len == 0x10)) {
    hash_len._4_4_ =
         wally_addr_segwit_from_bytes(script,script_len,address_item->segwit_prefix,0,output);
  }
  return hash_len._4_4_;
}

Assistant:

static int descriptor_scriptpubkey_to_address(
    const struct address_script_t *address_item,
    unsigned char *script,
    size_t script_len,
    char **output)
{
    int ret;
    int script_type = 0;
    size_t hash_len = 0;
    unsigned char hash[SHA256_LEN + 1];

    if ((script_len == WALLY_SCRIPTPUBKEY_P2PKH_LEN) &&
        (script[0] == OP_DUP) &&
        (script[1] == OP_HASH160) &&
        (script[2] == HASH160_LEN) &&
        (script[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 2] == OP_EQUALVERIFY) &&
        (script[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 1] == OP_CHECKSIG)) {
        script_type = WALLY_SCRIPT_TYPE_P2PKH;
        hash[0] = address_item->version_p2pkh;
        memcpy(&hash[1], &script[3], HASH160_LEN);
        hash_len = HASH160_LEN + 1;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2SH_LEN) &&
               (script[0] == OP_HASH160) &&
               (script[1] == HASH160_LEN) &&
               (script[WALLY_SCRIPTPUBKEY_P2SH_LEN - 1] == OP_EQUAL)) {
        script_type = WALLY_SCRIPT_TYPE_P2SH;
        hash[0] = address_item->version_p2sh;
        memcpy(&hash[1], &script[2], HASH160_LEN);
        hash_len = HASH160_LEN + 1;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2WPKH_LEN) &&
               (script[0] == OP_0) && (script[1] == HASH160_LEN)) {
        script_type = WALLY_SCRIPT_TYPE_P2WPKH;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2WSH_LEN) &&
               (script[0] == OP_0) &&
               (script[1] == SHA256_LEN)) {
        script_type = WALLY_SCRIPT_TYPE_P2WSH;
        /* feature: append witness v1 */
    } else {
        ret = WALLY_EINVAL;
    }

    if ((script_type == WALLY_SCRIPT_TYPE_P2PKH) || (script_type == WALLY_SCRIPT_TYPE_P2SH)) {
        ret = wally_base58_from_bytes(hash, hash_len, BASE58_FLAG_CHECKSUM, output);
    } else if ((script_type == WALLY_SCRIPT_TYPE_P2WPKH) ||
               (script_type == WALLY_SCRIPT_TYPE_P2WSH)) {
        ret = wally_addr_segwit_from_bytes(script, script_len, address_item->segwit_prefix, 0, output);
    }
    return ret;
}